

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPluginAPI.cxx
# Opt level: O0

void cmDestroySourceFile(void *arg)

{
  cmCPluginAPISourceFile *sf;
  void *arg_local;
  
  if ((*arg == 0) && (arg != (void *)0x0)) {
    cmCPluginAPISourceFile::~cmCPluginAPISourceFile((cmCPluginAPISourceFile *)arg);
    operator_delete(arg,0xb8);
  }
  return;
}

Assistant:

static void CCONV cmDestroySourceFile(void* arg)
{
  cmCPluginAPISourceFile* sf = static_cast<cmCPluginAPISourceFile*>(arg);
  // Only delete if it was created by cmCreateSourceFile or
  // cmCreateNewSourceFile and is therefore not in the map.
  if (!sf->RealSourceFile) {
    delete sf;
  }
}